

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O0

void __thiscall
TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *cp)

{
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *unaff_retaddr;
  TPZStack<TPZEqnArray<float>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<float,TPZFileEqnStorage<float>,TPZFrontSym<float>>>
            (in_RDI,0x21);
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::TPZFrontMatrix
            (unaff_retaddr,(void **)vtt,in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_025522e0;
  TPZStack<TPZEqnArray<float>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x2c0) = 0;
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x2d0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  std::mutex::mutex((mutex *)0x1d37523);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2f0));
  TPZManVector<TPZEqnArray<float>_*,_10>::Resize
            ((TPZManVector<TPZEqnArray<float>_*,_10> *)in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}